

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int bitset_container_get_index(bitset_container_t *container,uint16_t x)

{
  uint64_t *puVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  puVar1 = container->words;
  uVar3 = CONCAT62(in_register_00000032,x) >> 6 & 0x3ffffff;
  if ((puVar1[uVar3] >> ((ulong)x & 0x3f) & 1) != 0) {
    uVar5 = 0;
    if (x < 0x40) {
      iVar6 = -1;
      uVar3 = uVar5;
    }
    else {
      uVar7 = 0;
      do {
        uVar2 = puVar1[uVar7] - (puVar1[uVar7] >> 1 & 0x5555555555555555);
        uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
        uVar4 = (int)uVar5 +
                (uint)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
        ;
        uVar5 = (ulong)uVar4;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
      iVar6 = uVar4 - 1;
    }
    uVar3 = (2L << ((byte)x & 0x3f)) - 1U & puVar1[uVar3];
    uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
    uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
    return (uint)(byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
           iVar6;
  }
  return -1;
}

Assistant:

int bitset_container_get_index(const bitset_container_t *container, uint16_t x) {
  if (bitset_container_get(container, x)) {
    // credit: aqrit
    int sum = 0;
    int i = 0;
    for (int end = x / 64; i < end; i++){
      sum += roaring_hamming(container->words[i]);
    }
    uint64_t lastword = container->words[i];
    uint64_t lastpos = UINT64_C(1) << (x % 64);
    uint64_t mask = lastpos + lastpos - 1; // smear right
    sum += roaring_hamming(lastword & mask);
    return sum - 1;
  } else {
    return -1;
  }
}